

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxas.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
nxas::assemble(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
              string *code,char *filename)

{
  size_t sVar1;
  bool bVar2;
  char *text_;
  range_difference_t<const_std::__cxx11::basic_string<char>_&> rVar3;
  reference pvVar4;
  uint64_t uVar5;
  size_type sVar6;
  size_t in_R9;
  span<const_opcode,_18446744073709551615UL> opcodes_00;
  span<const_unsigned_long,_18446744073709551615UL> local_1a8;
  value_type_conflict1 local_198;
  span<const_opcode,_18446744073709551615UL> local_190;
  ulong local_180;
  size_t address;
  uint64_t sched;
  vector<unsigned_long,_std::allocator<unsigned_long>_> blob;
  size_t num_instructions;
  size_t index;
  undefined1 local_140 [8];
  vector<opcode,_std::allocator<opcode>_> opcodes;
  undefined1 local_111;
  size_type local_110;
  size_t max_decode_instructions;
  context ctx;
  char *filename_local;
  string *code_local;
  
  ctx._224_8_ = filename;
  text_ = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    (code);
  context::context((context *)&max_decode_instructions,filename,text_);
  local_111 = 0x3b;
  rVar3 = std::ranges::__count_fn::
          operator()<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char,_std::identity>
                    ((__count_fn *)&std::ranges::count,code,&local_111);
  local_110 = rVar3 + 1U;
  std::allocator<opcode>::allocator((allocator<opcode> *)((long)&index + 7));
  std::vector<opcode,_std::allocator<opcode>_>::vector
            ((vector<opcode,_std::allocator<opcode>_> *)local_140,rVar3 + 1U,
             (allocator<opcode> *)((long)&index + 7));
  std::allocator<opcode>::~allocator((allocator<opcode> *)((long)&index + 7));
  num_instructions = 0;
  sVar1 = num_instructions;
  do {
    num_instructions = sVar1;
    pvVar4 = std::vector<opcode,_std::allocator<opcode>_>::operator[]
                       ((vector<opcode,_std::allocator<opcode>_> *)local_140,num_instructions);
    bVar2 = parse_instruction((context *)&max_decode_instructions,pvVar4);
    sVar1 = num_instructions + 1;
  } while (bVar2);
  if (num_instructions + 1 != local_110) {
    __assert_fail("index == max_decode_instructions",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/nxas.cpp"
                  ,0x28,"std::vector<uint64_t> nxas::assemble(const std::string &, const char *)");
  }
  blob.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)num_instructions;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sched);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sched,
             (local_110 << 2) / 3 + 4);
  for (num_instructions = 0;
      num_instructions <
      blob.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage; num_instructions = num_instructions + 1) {
    if (num_instructions % 3 == 0) {
      address = 0;
      for (local_180 = 0; local_180 < 3; local_180 = local_180 + 1) {
        std::span<const_opcode,_18446744073709551615UL>::
        span<std::vector<opcode,_std::allocator<opcode>_>_&>
                  (&local_190,(vector<opcode,_std::allocator<opcode>_> *)local_140);
        opcodes_00._M_extent._M_extent_value = num_instructions;
        opcodes_00._M_ptr = (pointer)local_190._M_extent._M_extent_value;
        uVar5 = generate_sched((nxas *)local_190._M_ptr,opcodes_00,
                               (size_t)blob.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,local_180,
                               in_R9);
        address = uVar5 | address;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sched,&address);
    }
    pvVar4 = std::vector<opcode,_std::allocator<opcode>_>::operator[]
                       ((vector<opcode,_std::allocator<opcode>_> *)local_140,num_instructions);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sched,&pvVar4->value);
  }
  while (sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sched),
        (sVar6 & 3) != 0) {
    local_198 = 0x50b0000000070f00;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sched,&local_198);
  }
  std::span<const_unsigned_long,_18446744073709551615UL>::
  span<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>
            (&local_1a8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sched);
  context::binary(__return_storage_ptr__,(context *)&max_decode_instructions,local_1a8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sched);
  std::vector<opcode,_std::allocator<opcode>_>::~vector
            ((vector<opcode,_std::allocator<opcode>_> *)local_140);
  context::~context((context *)&max_decode_instructions);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> assemble(const std::string& code, const char* filename)
{
    // Prepare our context
    context ctx(filename, code.c_str());

    // To determine the number of instructions to allocate we count the number of semicolons this
    // is possible because every instruction ends with a semicolon on the number of decoding
    // instructions we allocate one extra because one instruction might be bugged and it won't have
    // a semicolon (which will trigger a fatal)
    const size_t max_decode_instructions = std::ranges::count(code, ';') + 1;
    std::vector<opcode> opcodes(max_decode_instructions);

    size_t index = 0;
    while (parse_instruction(ctx, opcodes[index++])) {
    }
    assert(index == max_decode_instructions);
    const size_t num_instructions = index - 1;

    std::vector<uint64_t> blob;
    blob.reserve(max_decode_instructions * 4 / 3 + 4);
    for (index = 0; index < num_instructions; ++index) {
        if (index % 3 == 0) {
            uint64_t sched = 0;
            for (size_t address = 0; address < 3; ++address) {
                sched |= generate_sched(opcodes, index, num_instructions, address);
            }
            blob.push_back(sched);
        }
        blob.push_back(opcodes[index].value);
    }
    while (blob.size() % 4) {
        blob.push_back(0x50B0000000070F00ULL);
    }
    return ctx.binary(blob);
}